

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void Json::CharReaderBuilder::strictMode(Value *settings)

{
  Value *pVVar1;
  Value local_30;
  
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowComments");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowTrailingCommas");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,true);
  pVVar1 = Value::operator[](settings,"strictRoot");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowDroppedNullPlaceholders");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowNumericKeys");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowSingleQuotes");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,1000);
  pVVar1 = Value::operator[](settings,"stackLimit");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,true);
  pVVar1 = Value::operator[](settings,"failIfExtra");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,true);
  pVVar1 = Value::operator[](settings,"rejectDupKeys");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowSpecialFloats");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  return;
}

Assistant:

void CharReaderBuilder::strictMode(Json::Value* settings) {
  //! [CharReaderBuilderStrictMode]
  (*settings)["allowComments"] = false;
  (*settings)["allowTrailingCommas"] = false;
  (*settings)["strictRoot"] = true;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = true;
  (*settings)["rejectDupKeys"] = true;
  (*settings)["allowSpecialFloats"] = false;
  //! [CharReaderBuilderStrictMode]
}